

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenerators::EndsWith(cmQtAutoGenerators *this,string *str,string *with)

{
  int iVar1;
  bool bVar2;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  if (str->_M_string_length < with->_M_string_length) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)str);
    if (local_28 == with->_M_string_length) {
      if (local_28 == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_30,(with->_M_dataplus)._M_p,local_28);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::EndsWith(const std::string& str,
                                  const std::string& with)
{
  if (with.length() > (str.length()))
    {
    return false;
    }
  return (str.substr(str.length() - with.length(), with.length()) == with);
}